

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTarget::ReportPropertyOrigin
          (cmTarget *this,string *p,string *result,string *report,string *compatibilityType)

{
  pointer pcVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  char *__s;
  size_t sVar3;
  mapped_type *pmVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  long *plVar6;
  cmake *this_01;
  long *plVar7;
  size_type *psVar8;
  bool bVar9;
  string areport;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  undefined1 local_108 [32];
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_e8;
  PositionType local_e0;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  string *local_98;
  string *local_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68 [2];
  long local_58 [2];
  Snapshot local_48;
  
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = this->Makefile;
  pcVar1 = local_108 + 0x10;
  local_108._0_8_ = pcVar1;
  local_98 = report;
  local_90 = result;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_108,"CMAKE_DEBUG_TARGET_PROPERTIES","");
  __s = cmMakefile::GetDefinition(this_00,(string *)local_108);
  if ((pointer)local_108._0_8_ != pcVar1) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
  }
  if (__s != (char *)0x0) {
    local_108._0_8_ = pcVar1;
    sVar3 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,__s,__s + sVar3);
    cmSystemTools::ExpandListArgument((string *)local_108,&local_b8,false);
    if ((pointer)local_108._0_8_ != pcVar1) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
  }
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[](&this->DebugCompatiblePropertiesDone,p);
  if (*pmVar4 == false) {
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (local_b8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_b8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,p);
    bVar9 = _Var5._M_current !=
            local_b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar9 = false;
  }
  if (this->Makefile->Configured == true) {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&this->DebugCompatiblePropertiesDone,p);
    *pmVar4 = true;
  }
  if (bVar9) {
    pcVar2 = (compatibilityType->_M_dataplus)._M_p;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar2,pcVar2 + compatibilityType->_M_string_length);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68," of property \"","");
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_68,(ulong)(p->_M_dataplus)._M_p);
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_78 = *plVar7;
      lStack_70 = plVar6[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar7;
      local_88 = (long *)*plVar6;
    }
    local_80 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
    psVar8 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar8) {
      local_108._16_8_ = *psVar8;
      local_108._24_8_ = plVar6[3];
      local_108._0_8_ = pcVar1;
    }
    else {
      local_108._16_8_ = *psVar8;
      local_108._0_8_ = (size_type *)*plVar6;
    }
    local_108._8_8_ = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_d8,local_108._0_8_);
    if ((pointer)local_108._0_8_ != pcVar1) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    pcVar2 = (this->Name)._M_dataplus._M_p;
    local_108._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_108,pcVar2,pcVar2 + (this->Name)._M_string_length);
    std::__cxx11::string::_M_append((char *)&local_d8,local_108._0_8_);
    if ((pointer)local_108._0_8_ != pcVar1) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    std::__cxx11::string::append((char *)&local_d8);
    std::__cxx11::string::_M_append((char *)&local_d8,(ulong)(local_90->_M_dataplus)._M_p);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "\"):\n",local_98);
    std::__cxx11::string::_M_append((char *)&local_d8,local_108._0_8_);
    if ((pointer)local_108._0_8_ != pcVar1) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    this_01 = cmMakefile::GetCMakeInstance(this->Makefile);
    cmState::Snapshot::Snapshot(&local_48,(cmState *)0x0,(PositionType)ZEXT816(0));
    local_e0 = local_48.Position.Position;
    local_108._24_8_ = local_48.State;
    pcStack_e8 = local_48.Position.Tree;
    local_108._0_8_ = (pointer)0x0;
    local_108._8_8_ = (pointer)0x0;
    local_108._16_8_ = 0;
    cmake::IssueMessage(this_01,LOG,&local_d8,(cmListFileBacktrace *)local_108);
    std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
              ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

void
cmTarget::ReportPropertyOrigin(const std::string &p,
                               const std::string &result,
                               const std::string &report,
                               const std::string &compatibilityType) const
{
  std::vector<std::string> debugProperties;
  const char *debugProp =
          this->Makefile->GetDefinition("CMAKE_DEBUG_TARGET_PROPERTIES");
  if (debugProp)
    {
    cmSystemTools::ExpandListArgument(debugProp, debugProperties);
    }

  bool debugOrigin = !this->DebugCompatiblePropertiesDone[p]
                    && std::find(debugProperties.begin(),
                                 debugProperties.end(),
                                 p)
                        != debugProperties.end();

  if (this->Makefile->IsConfigured())
    {
    this->DebugCompatiblePropertiesDone[p] = true;
    }
  if (!debugOrigin)
    {
    return;
    }

  std::string areport = compatibilityType;
  areport += std::string(" of property \"") + p + "\" for target \"";
  areport += std::string(this->GetName());
  areport += "\" (result: \"";
  areport += result;
  areport += "\"):\n" + report;

  this->Makefile->GetCMakeInstance()->IssueMessage(cmake::LOG, areport);
}